

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::ElementWidth(Type *type)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_00;
  
  while( true ) {
    iVar1 = (*type->_vptr_Type[0xe])(type);
    if (CONCAT44(extraout_var,iVar1) == 0) break;
    type = *(Type **)(CONCAT44(extraout_var,iVar1) + 0x28);
  }
  iVar1 = (*type->_vptr_Type[0xc])(type);
  lVar2 = CONCAT44(extraout_var_00,iVar1);
  if (lVar2 == 0) {
    iVar1 = (*type->_vptr_Type[10])(type);
    if (CONCAT44(extraout_var_01,iVar1) == 0) {
      __assert_fail("type->AsInteger()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x55,
                    "uint32_t spvtools::opt::(anonymous namespace)::ElementWidth(const analysis::Type *)"
                   );
    }
    iVar1 = (*type->_vptr_Type[10])(type);
    lVar2 = CONCAT44(extraout_var_02,iVar1);
  }
  return *(uint32_t *)(lVar2 + 0x24);
}

Assistant:

uint32_t ElementWidth(const analysis::Type* type) {
  if (const analysis::Vector* vec_type = type->AsVector()) {
    return ElementWidth(vec_type->element_type());
  } else if (const analysis::Float* float_type = type->AsFloat()) {
    return float_type->width();
  } else {
    assert(type->AsInteger());
    return type->AsInteger()->width();
  }
}